

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_ar.c
# Opt level: O0

int archive_read_format_ar_read_header(archive_read *a,archive_entry *entry)

{
  char *h;
  int ret;
  void *header_data;
  size_t unconsumed;
  ar *ar;
  archive_entry *entry_local;
  archive_read *a_local;
  
  unconsumed = (size_t)a->format->data;
  ar = (ar *)entry;
  entry_local = (archive_entry *)a;
  if (*(char *)(unconsumed + 0x30) == '\0') {
    __archive_read_consume(a,8);
    *(undefined1 *)(unconsumed + 0x30) = 1;
    entry_local->stat_valid = L'\x00070000';
  }
  h = (char *)__archive_read_ahead((archive_read *)entry_local,0x3c,(ssize_t *)0x0);
  if (h == (char *)0x0) {
    a_local._4_4_ = 1;
  }
  else {
    header_data = (void *)0x3c;
    a_local._4_4_ =
         _ar_read_header((archive_read *)entry_local,(archive_entry *)ar,(ar *)unconsumed,h,
                         (size_t *)&header_data);
    if (header_data != (void *)0x0) {
      __archive_read_consume((archive_read *)entry_local,(int64_t)header_data);
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
archive_read_format_ar_read_header(struct archive_read *a,
    struct archive_entry *entry)
{
	struct ar *ar = (struct ar*)(a->format->data);
	size_t unconsumed;
	const void *header_data;
	int ret;

	if (!ar->read_global_header) {
		/*
		 * We are now at the beginning of the archive,
		 * so we need first consume the ar global header.
		 */
		__archive_read_consume(a, 8);
		ar->read_global_header = 1;
		/* Set a default format code for now. */
		a->archive.archive_format = ARCHIVE_FORMAT_AR;
	}

	/* Read the header for the next file entry. */
	if ((header_data = __archive_read_ahead(a, 60, NULL)) == NULL)
		/* Broken header. */
		return (ARCHIVE_EOF);

	unconsumed = 60;

	ret = _ar_read_header(a, entry, ar, (const char *)header_data, &unconsumed);

	if (unconsumed)
		__archive_read_consume(a, unconsumed);

	return ret;
}